

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

int Exa_ManMarkup(Exa_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int (*paaiVar6) [2] [32];
  int (*paaiVar7) [2] [32];
  ulong uVar8;
  bool bVar9;
  
  if (0x20 < p->nObjs) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x1c4,"int Exa_ManMarkup(Exa_Man_t *)");
  }
  p->iVar = p->nNodes * 3 + 1;
  lVar4 = (long)p->nVars;
  if (p->nVars < p->nObjs) {
    paaiVar6 = p->VarMarks + lVar4;
    do {
      lVar5 = 0;
      paaiVar7 = paaiVar6;
      do {
        iVar1 = p->pPars->fFewerVars;
        if ((iVar1 == 0) || (lVar5 != 0)) {
LAB_0059b03a:
          uVar3 = 1 - (int)lVar5;
          if (iVar1 == 0) {
            uVar3 = 0;
          }
          if ((long)(ulong)uVar3 < lVar4 - lVar5) {
            uVar8 = (ulong)uVar3;
            do {
              if (p->iVar < 0) goto LAB_0059b0d7;
              Vec_WecPush(p->vOutLits,(int)uVar8,p->iVar * 2);
              iVar1 = p->iVar;
              p->iVar = iVar1 + 1;
              (*paaiVar7)[0][uVar8] = iVar1;
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < lVar4 - lVar5);
          }
        }
        else {
          iVar2 = p->nObjs;
          if (iVar2 + -1 != (int)lVar4) goto LAB_0059b03a;
          if (p->iVar < 0) {
LAB_0059b0d7:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_WecPush(p->vOutLits,iVar2 + -2,p->iVar * 2);
          iVar1 = p->iVar;
          p->iVar = iVar1 + 1;
          p->VarMarks[lVar4 + -1][1][(long)iVar2 + 0x1e] = iVar1;
        }
        paaiVar7 = (int (*) [2] [32])(*paaiVar7 + 1);
        bVar9 = lVar5 == 0;
        lVar5 = lVar5 + 1;
      } while (bVar9);
      lVar4 = lVar4 + 1;
      paaiVar6 = paaiVar6 + 1;
    } while (lVar4 < p->nObjs);
  }
  printf("The number of parameter variables = %d.\n",(ulong)(uint)p->iVar);
  return p->iVar;
}

Assistant:

int Exa_ManMarkup( Exa_Man_t * p )
{
    int i, k, j;
    assert( p->nObjs <= MAJ_NOBJS );
    // assign functionality
    p->iVar = 1 + p->nNodes * 3;
    // assign connectivity variables
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 2; k++ )
        {
            if ( p->pPars->fFewerVars && i == p->nObjs - 1 && k == 0 )
            {
                j = p->nObjs - 2;
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
                continue;
            }
            for ( j = p->pPars->fFewerVars ? 1 - k : 0; j < i - k; j++ )
            {
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
            }
        }
    }
    printf( "The number of parameter variables = %d.\n", p->iVar );
    return p->iVar;
    // printout
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        printf( "Node %d\n", i );
        for ( j = 0; j < p->nObjs; j++ )
        {
            for ( k = 0; k < 2; k++ )
                printf( "%3d ", p->VarMarks[i][k][j] );
            printf( "\n" );
        }
    }
    return p->iVar;
}